

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# musashi_softfloat.c
# Opt level: O3

floatx80 normalizeRoundAndPackFloatx80
                   (int8 roundingPrecision,flag zSign,int32 zExp,bits64 zSig0,bits64 zSig1)

{
  uint uVar1;
  ulong zSig0_00;
  int iVar2;
  ulong uVar3;
  byte bVar4;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  floatx80 fVar9;
  
  uVar3 = zSig1;
  zSig0_00 = zSig0;
  if (zSig0 == 0) {
    uVar3 = 0;
    zSig0_00 = zSig1;
  }
  uVar5 = zSig0_00 >> 0x20;
  uVar6 = uVar5;
  if (uVar5 == 0) {
    uVar6 = zSig0_00;
  }
  uVar8 = (uint)uVar6 << 0x10;
  if (uVar6 >= 0x10000) {
    uVar8 = (uint)uVar6;
  }
  bVar4 = (uVar6 < 0x10000) * '\x10';
  bVar7 = bVar4 + 8;
  uVar1 = uVar8 << 8;
  if (0xffffff < uVar8) {
    bVar7 = bVar4;
    uVar1 = uVar8;
  }
  bVar7 = (bVar7 | (uVar5 == 0) << 5) + countLeadingZeros32_countLeadingZerosHigh[uVar1 >> 0x18];
  if (bVar7 != 0) {
    zSig0_00 = zSig0_00 << (bVar7 & 0x3f) | uVar3 >> (-bVar7 & 0x3f);
  }
  iVar2 = zExp + -0x40;
  if (zSig0 != 0) {
    iVar2 = zExp;
  }
  fVar9 = roundAndPackFloatx80
                    (roundingPrecision,zSign,iVar2 - (char)bVar7,zSig0_00,uVar3 << (bVar7 & 0x3f));
  return fVar9;
}

Assistant:

static floatx80
	normalizeRoundAndPackFloatx80(
		int8 roundingPrecision, flag zSign, int32 zExp, bits64 zSig0, bits64 zSig1
	)
{
	int8 shiftCount;

	if ( zSig0 == 0 ) {
		zSig0 = zSig1;
		zSig1 = 0;
		zExp -= 64;
	}
	shiftCount = countLeadingZeros64( zSig0 );
	shortShift128Left( zSig0, zSig1, shiftCount, &zSig0, &zSig1 );
	zExp -= shiftCount;
	return
		roundAndPackFloatx80( roundingPrecision, zSign, zExp, zSig0, zSig1 );

}